

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::internal::
       parse_format_specs<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  undefined1 *puVar1;
  char cVar2;
  basic_format_specs<char> *pbVar3;
  byte bVar4;
  uint uVar5;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_RAX;
  char *pcVar6;
  type tVar7;
  char *pcVar8;
  width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  local_18.handler = in_RAX;
  pcVar6 = parse_align<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                     (begin,end,handler);
  if (pcVar6 == end) {
    return pcVar6;
  }
  cVar2 = *pcVar6;
  if (cVar2 == ' ') {
    tVar7 = (handler->checker_).arg_type_;
    uVar5 = tVar7 - named_arg_type;
    if (uVar5 < 0xc) {
      bVar4 = 0x30;
LAB_0012d9f4:
      if ((uVar5 < 9) &&
         ((char_type < tVar7 || ((0x214U >> (tVar7 & (custom_type|pointer_type)) & 1) == 0)))) {
        pcVar6 = "format specifier requires signed argument";
        goto LAB_0012db3f;
      }
      pbVar3 = (handler->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar3->field_0x9 = pbVar3->field_0x9 & 0x8f | bVar4;
      pcVar6 = pcVar6 + 1;
LAB_0012da21:
      if (pcVar6 == end) {
        return pcVar6;
      }
      if (*pcVar6 == '#') {
        if (0xb < (handler->checker_).arg_type_ - named_arg_type) goto LAB_0012db38;
        puVar1 = &((handler->
                   super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                   ).super_specs_setter<char>.specs_)->field_0x9;
        *puVar1 = *puVar1 | 0x80;
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == end) {
          return pcVar6;
        }
      }
      if (*pcVar6 == '0') {
        if (0xb < (handler->checker_).arg_type_ - named_arg_type) goto LAB_0012db38;
        pbVar3 = (handler->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        pbVar3->field_0x9 = pbVar3->field_0x9 & 0xf0 | 4;
        (((handler->
          super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->fill).data_[0] = '0';
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == end) {
          return pcVar6;
        }
      }
      if (9 < (byte)(*pcVar6 - 0x30U)) {
        if (*pcVar6 == '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 != end) {
            local_18.handler = handler;
            pcVar6 = parse_arg_id<char,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                               (pcVar6,end,&local_18);
          }
          if ((pcVar6 == end) || (*pcVar6 != '}')) {
            pcVar6 = "invalid format string";
            goto LAB_0012db3f;
          }
          pcVar6 = pcVar6 + 1;
        }
LAB_0012db01:
        if (pcVar6 != end) {
          if (*pcVar6 == '.') {
            pcVar6 = parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                               (pcVar6,end,handler);
          }
          if ((pcVar6 != end) && (cVar2 = *pcVar6, cVar2 != '}')) {
            pcVar6 = pcVar6 + 1;
            ((handler->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_)->type = cVar2;
          }
        }
        return pcVar6;
      }
      uVar5 = 0;
      while (pcVar8 = pcVar6 + 1, uVar5 < 0xccccccd) {
        uVar5 = ((int)*pcVar6 + uVar5 * 10) - 0x30;
        pcVar6 = end;
        if ((pcVar8 == end) || (pcVar6 = pcVar8, 9 < (byte)(*pcVar8 - 0x30U))) goto LAB_0012daf8;
      }
      uVar5 = 0x80000000;
LAB_0012daf8:
      if (-1 < (int)uVar5) {
        ((handler->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->width = uVar5;
        goto LAB_0012db01;
      }
      pcVar6 = "number is too big";
      goto LAB_0012db3f;
    }
  }
  else if (cVar2 == '-') {
    tVar7 = (handler->checker_).arg_type_;
    uVar5 = tVar7 - named_arg_type;
    if (uVar5 < 0xc) {
      bVar4 = 0x10;
      goto LAB_0012d9f4;
    }
  }
  else {
    if (cVar2 != '+') goto LAB_0012da21;
    tVar7 = (handler->checker_).arg_type_;
    uVar5 = tVar7 - named_arg_type;
    if (uVar5 < 0xc) {
      bVar4 = 0x20;
      goto LAB_0012d9f4;
    }
  }
LAB_0012db38:
  pcVar6 = "format specifier requires numeric argument";
LAB_0012db3f:
  error_handler::on_error((error_handler *)&local_18,pcVar6);
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end || *begin == '}') return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}